

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::wrapContext(Exception *this,char *file,int line,String *description)

{
  String *params_2;
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> *params_3;
  undefined1 local_48 [40];
  String *description_local;
  Event *pEStack_18;
  int line_local;
  char *file_local;
  Exception *this_local;
  
  local_48._32_8_ = description;
  description_local._4_4_ = line;
  pEStack_18 = (Event *)file;
  file_local = (char *)this;
  params_2 = mv<kj::String>(description);
  params_3 = mv<kj::Maybe<kj::Own<kj::Exception::Context,decltype(nullptr)>>>(&this->context);
  heap<kj::Exception::Context,char_const*&,int&,kj::String,kj::Maybe<kj::Own<kj::Exception::Context,decltype(nullptr)>>>
            ((kj *)local_48,(char **)&stack0xffffffffffffffe8,(int *)((long)&description_local + 4),
             params_2,params_3);
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> *)(local_48 + 0x10),
             (Own<kj::Exception::Context,_std::nullptr_t> *)local_48);
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::operator=
            (&this->context,
             (Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> *)(local_48 + 0x10));
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> *)(local_48 + 0x10));
  Own<kj::Exception::Context,_std::nullptr_t>::~Own
            ((Own<kj::Exception::Context,_std::nullptr_t> *)local_48);
  return;
}

Assistant:

void Exception::wrapContext(const char* file, int line, String&& description) {
  context = heap<Context>(file, line, mv(description), mv(context));
}